

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotateVector.h
# Opt level: O0

Vector3T<float> __thiscall
Gs::RotateVectorAroundAxis<float>(Gs *this,Vector3T<float> *vec,Vector3T<float> *axis,Real angle)

{
  float fVar1;
  float fVar2;
  double dVar3;
  undefined8 extraout_XMM0_Qa;
  float fVar4;
  Vector3T<float> VVar5;
  float local_60;
  float local_5c;
  float local_58;
  undefined1 local_54 [8];
  Vector3T<float> row2;
  Vector3T<float> row1;
  Vector3T<float> row0;
  float cInv;
  float c;
  float s;
  Real angle_local;
  Vector3T<float> *axis_local;
  Vector3T<float> *vec_local;
  
  Vector<float,_3UL>::Normalize(axis);
  dVar3 = std::sin((double)(ulong)(uint)angle);
  fVar1 = SUB84(dVar3,0);
  dVar3 = std::cos((double)(ulong)(uint)angle);
  fVar4 = SUB84(dVar3,0);
  fVar2 = 1.0 - fVar4;
  Vector<float,_3UL>::Vector((Vector<float,_3UL> *)&row1.y);
  Vector<float,_3UL>::Vector((Vector<float,_3UL> *)&row2.y);
  Vector<float,_3UL>::Vector((Vector<float,_3UL> *)local_54);
  row1.y = axis->x * axis->x + fVar4 * (-axis->x * axis->x + 1.0);
  row1.z = axis->x * axis->y * fVar2 + -(fVar1 * axis->z);
  row2.y = axis->x * axis->y * fVar2 + fVar1 * axis->z;
  row2.z = axis->y * axis->y + fVar4 * (-axis->y * axis->y + 1.0);
  row1.x = axis->y * axis->z * fVar2 + -(fVar1 * axis->x);
  local_54._0_4_ = axis->x * axis->z * fVar2 + -(fVar1 * axis->y);
  local_54._4_4_ = axis->y * axis->z * fVar2 + fVar1 * axis->x;
  fVar4 = fVar4 * (-axis->z * axis->z + 1.0);
  row2.x = axis->z * axis->z + fVar4;
  local_58 = Dot<Gs::Vector<float,3ul>,float>(vec,(Vector<float,_3UL> *)&row1.y);
  local_5c = Dot<Gs::Vector<float,3ul>,float>(vec,(Vector<float,_3UL> *)&row2.y);
  local_60 = Dot<Gs::Vector<float,3ul>,float>(vec,(Vector<float,_3UL> *)local_54);
  Vector<float,_3UL>::Vector((Vector<float,_3UL> *)this,&local_58,&local_5c,&local_60);
  VVar5.z = fVar4;
  VVar5.x = (float)(int)extraout_XMM0_Qa;
  VVar5.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar5;
}

Assistant:

Vector3T<T> RotateVectorAroundAxis(const Vector3T<T>& vec, Vector3T<T> axis, Real angle)
{
    axis.Normalize();

    auto s       = std::sin(angle);
    auto c       = std::cos(angle);
    auto cInv    = Real(1) - c;

    Vector3T<T> row0, row1, row2;

    row0.x = axis.x*axis.x + c*(Real(1) - axis.x*axis.x);
    row0.y = axis.x*axis.y*cInv - s*axis.z;
    row0.z = axis.x*axis.z*cInv + s*axis.y;

    row1.x = axis.x*axis.y*cInv + s*axis.z;
    row1.y = axis.y*axis.y + c*(Real(1) - axis.y*axis.y);
    row1.z = axis.y*axis.z*cInv - s*axis.x;

    row2.x = axis.x*axis.z*cInv - s*axis.y;
    row2.y = axis.y*axis.z*cInv + s*axis.x;
    row2.z = axis.z*axis.z + c*(Real(1) - axis.z*axis.z);

    return Vector3T<T>(
        Dot(vec, row0),
        Dot(vec, row1),
        Dot(vec, row2)
    );
}